

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O2

size_t ptls_asn1_read_length
                 (uint8_t *bytes,size_t bytes_max,size_t byte_index,uint32_t *length,
                 int *indefinite_length,size_t *last_byte,int *decode_error,int level,
                 ptls_minicrypto_log_ctx_t *log_ctx)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  size_t byte_index_00;
  int i;
  uint uVar5;
  uint uVar6;
  
  *indefinite_length = 0;
  *length = 0;
  *last_byte = bytes_max;
  if (bytes_max <= byte_index) {
    return byte_index;
  }
  bVar1 = bytes[byte_index];
  uVar3 = (ulong)bVar1;
  byte_index_00 = byte_index + 1;
  *length = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    *length = 0;
    uVar4 = bVar1 & 0x7f;
    if (bytes_max <= byte_index_00 + uVar4) {
      ptls_asn1_error_message("Incorrect length coding",bytes_max,byte_index_00,level,log_ctx);
      iVar2 = 0x236;
      goto LAB_0010f70a;
    }
    uVar6 = 0;
    uVar5 = 0;
    for (; (uVar5 < uVar4 && (byte_index_00 < bytes_max)); byte_index_00 = byte_index_00 + 1) {
      *length = uVar6 << 8;
      uVar6 = uVar6 << 8 | (uint)bytes[byte_index_00];
      *length = uVar6;
      uVar5 = uVar5 + 1;
    }
    if ((bVar1 & 0x7f) != 0) {
      uVar3 = (ulong)uVar6;
      goto LAB_0010f68f;
    }
    *last_byte = bytes_max;
    *indefinite_length = 1;
    uVar3 = bytes_max;
  }
  else {
LAB_0010f68f:
    *last_byte = uVar3 + byte_index_00;
    uVar3 = uVar3 + byte_index_00;
  }
  if (*decode_error != 0) {
    return byte_index_00;
  }
  if (uVar3 <= bytes_max) {
    return byte_index_00;
  }
  ptls_asn1_error_message("Length larger than message",bytes_max,byte_index_00,level,log_ctx);
  iVar2 = 0x237;
LAB_0010f70a:
  *decode_error = iVar2;
  return byte_index_00;
}

Assistant:

size_t ptls_asn1_read_length(const uint8_t *bytes, size_t bytes_max, size_t byte_index, uint32_t *length, int *indefinite_length,
                             size_t *last_byte, int *decode_error, int level, ptls_minicrypto_log_ctx_t *log_ctx)
{
    int length_of_length = 0;

    *indefinite_length = 0;
    *length = 0;
    *last_byte = bytes_max;

    if (byte_index < bytes_max) {
        *length = bytes[byte_index++];
        if ((*length & 128) != 0) {
            length_of_length = *length & 127;
            *length = 0;

            if (byte_index + length_of_length >= bytes_max) {
                /* This is an error */
                byte_index = ptls_asn1_error_message("Incorrect length coding", bytes_max, byte_index, level, log_ctx);
                *decode_error = PTLS_ERROR_BER_MALFORMED_LENGTH;
            } else {
                for (int i = 0; i < length_of_length && byte_index < bytes_max; i++) {
                    *length <<= 8;
                    *length |= bytes[byte_index++];
                }

                if (length_of_length == 0) {
                    *last_byte = bytes_max;
                    *indefinite_length = 1;
                } else {
                    *last_byte = byte_index + *length;
                }
            }
        } else {
            *last_byte = byte_index + *length;
        }

        if (*decode_error == 0) {
            /* TODO: verify that the length makes sense */
            if (*last_byte > bytes_max) {
                byte_index = ptls_asn1_error_message("Length larger than message", bytes_max, byte_index, level, log_ctx);
                *decode_error = PTLS_ERROR_BER_EXCESSIVE_LENGTH;
            }
        }
    }

    return byte_index;
}